

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O0

clock_rational_value_t
tchecker::delay(clockval_t *src,clock_constraint_container_t *invariant,
               clock_constraint_container_t *guard,clock_reset_container_t *reset,clockval_t *tgt)

{
  clock_rational_value_t cVar1;
  type_conflict1 tVar2;
  bool bVar3;
  capacity_t_conflict cVar4;
  capacity_t_conflict cVar5;
  rational<long> *prVar6;
  __tuple_element_t<0UL,_tuple<delay_constraint_t,_delay_constraint_t>_> *dc2;
  int local_1e0 [2];
  type local_1d8;
  type local_1c8;
  int local_1b8 [2];
  rational<long> local_1b0;
  type local_1a0;
  int local_18c [3];
  delay_constraint_t local_180;
  undefined1 local_168 [8];
  delay_constraint_t upper;
  undefined1 local_138 [8];
  delay_constraint_t lower;
  type *upper_reset;
  type *lower_reset;
  tuple<tchecker::delay_constraint_t,_tchecker::delay_constraint_t> *local_e0;
  __tuple_element_t<1UL,_tuple<delay_constraint_t,_delay_constraint_t>_> *local_d8;
  type *upper_invariant;
  type *lower_invariant;
  tuple<tchecker::delay_constraint_t,_tchecker::delay_constraint_t> *local_98;
  __tuple_element_t<1UL,_tuple<delay_constraint_t,_delay_constraint_t>_> *local_90;
  type *upper_guard;
  type *lower_guard;
  tuple<tchecker::delay_constraint_t,_tchecker::delay_constraint_t> *local_50;
  int local_48 [2];
  make_array_t<boost::rational<long>,_16UL,_tchecker::clockval_base_t> *local_40;
  clockval_t *tgt_local;
  clock_reset_container_t *reset_local;
  clock_constraint_container_t *guard_local;
  clock_constraint_container_t *invariant_local;
  clockval_t *src_local;
  clock_rational_value_t delay;
  
  local_40 = &tgt->super_clock_value_array_t;
  tgt_local = (clockval_t *)reset;
  reset_local = (clock_reset_container_t *)guard;
  guard_local = invariant;
  invariant_local = (clock_constraint_container_t *)src;
  cVar4 = clockval_t::size(src);
  cVar5 = clockval_t::size((clockval_t *)local_40);
  if (cVar4 != cVar5) {
    __assert_fail("src.size() == tgt.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc"
                  ,0x327,
                  "tchecker::clock_rational_value_t tchecker::delay(const tchecker::clockval_t &, const tchecker::clock_constraint_container_t &, const tchecker::clock_constraint_container_t &, const tchecker::clock_reset_container_t &, const tchecker::clockval_t &)"
                 );
  }
  prVar6 = make_array_t<boost::rational<long>,_16UL,_tchecker::clockval_base_t>::operator[]
                     ((make_array_t<boost::rational<long>,_16UL,_tchecker::clockval_base_t> *)
                      invariant_local,0);
  local_48[1] = 0;
  tVar2 = boost::rational<long>::operator==(prVar6,local_48 + 1);
  if (!tVar2) {
    __assert_fail("src[0] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc"
                  ,0x328,
                  "tchecker::clock_rational_value_t tchecker::delay(const tchecker::clockval_t &, const tchecker::clock_constraint_container_t &, const tchecker::clock_constraint_container_t &, const tchecker::clock_reset_container_t &, const tchecker::clockval_t &)"
                 );
  }
  prVar6 = make_array_t<boost::rational<long>,_16UL,_tchecker::clockval_base_t>::operator[]
                     (local_40,0);
  local_48[0] = 0;
  tVar2 = boost::rational<long>::operator==(prVar6,local_48);
  if (!tVar2) {
    __assert_fail("tgt[0] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc"
                  ,0x329,
                  "tchecker::clock_rational_value_t tchecker::delay(const tchecker::clockval_t &, const tchecker::clock_constraint_container_t &, const tchecker::clock_constraint_container_t &, const tchecker::clock_reset_container_t &, const tchecker::clockval_t &)"
                 );
  }
  bVar3 = satisfies((clockval_t *)invariant_local,guard_local);
  if (bVar3) {
    delay_constraints((tuple<tchecker::delay_constraint_t,_tchecker::delay_constraint_t> *)
                      &lower_guard,(clockval_t *)invariant_local,
                      (clock_constraint_container_t *)reset_local);
    local_50 = (tuple<tchecker::delay_constraint_t,_tchecker::delay_constraint_t> *)&lower_guard;
    upper_guard = std::get<0ul,tchecker::delay_constraint_t,tchecker::delay_constraint_t>(local_50);
    local_90 = std::get<1ul,tchecker::delay_constraint_t,tchecker::delay_constraint_t>(local_50);
    delay_constraints((tuple<tchecker::delay_constraint_t,_tchecker::delay_constraint_t> *)
                      &lower_invariant,(clockval_t *)invariant_local,guard_local);
    local_98 = (tuple<tchecker::delay_constraint_t,_tchecker::delay_constraint_t> *)&lower_invariant
    ;
    upper_invariant =
         std::get<0ul,tchecker::delay_constraint_t,tchecker::delay_constraint_t>(local_98);
    local_d8 = std::get<1ul,tchecker::delay_constraint_t,tchecker::delay_constraint_t>(local_98);
    delay_constraints((tuple<tchecker::delay_constraint_t,_tchecker::delay_constraint_t> *)
                      &lower_reset,(tchecker *)invariant_local,tgt_local,
                      (clock_reset_container_t *)local_40,tgt);
    local_e0 = (tuple<tchecker::delay_constraint_t,_tchecker::delay_constraint_t> *)&lower_reset;
    dc2 = std::get<0ul,tchecker::delay_constraint_t,tchecker::delay_constraint_t>(local_e0);
    lower._16_8_ = std::get<1ul,tchecker::delay_constraint_t,tchecker::delay_constraint_t>(local_e0)
    ;
    max((delay_constraint_t *)&upper.strict,upper_guard,upper_invariant);
    max((delay_constraint_t *)local_138,(delay_constraint_t *)&upper.strict,dc2);
    min(&local_180,local_90,local_d8);
    min((delay_constraint_t *)local_168,&local_180,(delay_constraint_t *)lower._16_8_);
    bVar3 = boost::rational<long>::operator<
                      ((rational<long> *)local_168,(rational<long> *)local_138);
    if (bVar3) {
      local_18c[2] = 0xffffffff;
      boost::rational<long>::rational<int>((rational<long> *)&src_local,local_18c + 2,(type *)0x0);
    }
    else {
      bVar3 = boost::rational<long>::operator==
                        ((rational<long> *)local_168,(rational<long> *)local_138);
      if ((bVar3) && ((((byte)lower.bound.den & 1) != 0 || (((byte)upper.bound.den & 1) != 0)))) {
        local_18c[1] = 0xffffffff;
        boost::rational<long>::rational<int>((rational<long> *)&src_local,local_18c + 1,(type *)0x0)
        ;
      }
      else {
        local_18c[0] = 0;
        boost::rational<long>::rational<int>((rational<long> *)&src_local,local_18c,(type *)0x0);
        if (((byte)lower.bound.den & 1) == 0) {
          src_local = (clockval_t *)local_138;
          delay.num = lower.bound.num;
        }
        else {
          tVar2 = boost::rational<long>::operator==((rational<long> *)local_168,&dbm::INF_VALUE);
          if (tVar2) {
            local_1b8[1] = 5;
            local_1b8[0] = 10;
            boost::rational<long>::rational<int,int>(&local_1b0,local_1b8 + 1,local_1b8,(type *)0x0)
            ;
            local_1a0 = boost::operator+((rational<long> *)local_138,&local_1b0);
            src_local = (clockval_t *)local_1a0.num;
            delay.num = local_1a0.den;
          }
          else {
            local_1d8 = boost::operator+((rational<long> *)local_168,(rational<long> *)local_138);
            local_1e0[1] = 2;
            local_1c8 = boost::operator/(&local_1d8,local_1e0 + 1);
            src_local = (clockval_t *)local_1c8.num;
            delay.num = local_1c8.den;
          }
        }
        local_1e0[0] = 0;
        tVar2 = boost::operator>=((rational<long> *)&src_local,local_1e0);
        if (!tVar2) {
          __assert_fail("delay >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc"
                        ,0x341,
                        "tchecker::clock_rational_value_t tchecker::delay(const tchecker::clockval_t &, const tchecker::clock_constraint_container_t &, const tchecker::clock_constraint_container_t &, const tchecker::clock_reset_container_t &, const tchecker::clockval_t &)"
                       );
        }
      }
    }
    cVar1.den = delay.num;
    cVar1.num = (long)src_local;
    return cVar1;
  }
  __assert_fail("tchecker::satisfies(src, invariant)",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc"
                ,0x32a,
                "tchecker::clock_rational_value_t tchecker::delay(const tchecker::clockval_t &, const tchecker::clock_constraint_container_t &, const tchecker::clock_constraint_container_t &, const tchecker::clock_reset_container_t &, const tchecker::clockval_t &)"
               );
}

Assistant:

tchecker::clock_rational_value_t delay(tchecker::clockval_t const & src,
                                       tchecker::clock_constraint_container_t const & invariant,
                                       tchecker::clock_constraint_container_t const & guard,
                                       tchecker::clock_reset_container_t const & reset, tchecker::clockval_t const & tgt)
{
  assert(src.size() == tgt.size());
  assert(src[0] == 0);
  assert(tgt[0] == 0);
  assert(tchecker::satisfies(src, invariant));

  // get lower and upeer constraints on delays from guard, invariant and reset, then choose some delay in-between
  auto && [lower_guard, upper_guard] = tchecker::delay_constraints(src, guard);
  auto && [lower_invariant, upper_invariant] = tchecker::delay_constraints(src, invariant);
  auto && [lower_reset, upper_reset] = tchecker::delay_constraints(src, reset, tgt);

  tchecker::delay_constraint_t const lower = tchecker::max(tchecker::max(lower_guard, lower_invariant), lower_reset);
  tchecker::delay_constraint_t const upper = tchecker::min(tchecker::min(upper_guard, upper_invariant), upper_reset);

  if (upper.bound < lower.bound)
    return -1;
  if ((upper.bound == lower.bound) && (lower.strict || upper.strict))
    return -1;

  tchecker::clock_rational_value_t delay = 0;
  if (!lower.strict)
    delay = lower.bound;
  else if (upper.bound == tchecker::dbm::INF_VALUE)
    delay = lower.bound + tchecker::clock_rational_value_t{5, 10};
  else
    delay = (upper.bound + lower.bound) / 2;

  assert(delay >= 0);

  return delay;
}